

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O1

int png_image_begin_read_from_file(png_imagep image,char *file_name)

{
  undefined1 *puVar1;
  png_controlp ppVar2;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  int *piVar5;
  char *pcVar6;
  
  if (image == (png_imagep)0x0) {
    return 0;
  }
  if (image->version != 1) {
    pcVar6 = "png_image_begin_read_from_file: incorrect PNG_IMAGE_VERSION";
LAB_00121c43:
    iVar4 = png_image_error(image,pcVar6);
    return iVar4;
  }
  if (file_name == (char *)0x0) {
    pcVar6 = "png_image_begin_read_from_file: invalid argument";
    goto LAB_00121c43;
  }
  __stream = fopen(file_name,"rb");
  if (__stream == (FILE *)0x0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    iVar4 = png_image_error(image,pcVar6);
  }
  else {
    iVar4 = png_image_read_init(image);
    if (iVar4 == 0) {
      iVar4 = fclose(__stream);
      bVar3 = true;
      goto LAB_00121c77;
    }
    ppVar2 = image->opaque;
    ppVar2->png_ptr->io_ptr = __stream;
    puVar1 = &ppVar2->field_0x28;
    *puVar1 = *puVar1 | 2;
    iVar4 = png_safe_execute(image,png_image_read_header,image);
  }
  bVar3 = false;
LAB_00121c77:
  if (bVar3) {
    return 0;
  }
  return iVar4;
}

Assistant:

int PNGAPI
png_image_begin_read_from_file(png_imagep image, const char *file_name)
{
   if (image != NULL && image->version == PNG_IMAGE_VERSION)
   {
      if (file_name != NULL)
      {
         FILE *fp = fopen(file_name, "rb");

         if (fp != NULL)
         {
            if (png_image_read_init(image) != 0)
            {
               image->opaque->png_ptr->io_ptr = fp;
               image->opaque->owned_file = 1;
               return png_safe_execute(image, png_image_read_header, image);
            }

            /* Clean up: just the opened file. */
            (void)fclose(fp);
         }

         else
            return png_image_error(image, strerror(errno));
      }

      else
         return png_image_error(image,
             "png_image_begin_read_from_file: invalid argument");
   }

   else if (image != NULL)
      return png_image_error(image,
          "png_image_begin_read_from_file: incorrect PNG_IMAGE_VERSION");

   return 0;
}